

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpMeshHandler.c
# Opt level: O3

void sbfTcpMeshHandlerCloseSocket(sbfTcpMeshHandlerConnection c)

{
  if (c->mSocket != -1) {
    evutil_closesocket();
  }
  c->mSocket = -1;
  if (c->mEvent != (bufferevent *)0x0) {
    bufferevent_free();
  }
  c->mEvent = (bufferevent *)0x0;
  return;
}

Assistant:

static void
sbfTcpMeshHandlerCloseSocket (sbfTcpMeshHandlerConnection c)
{
    if (c->mSocket != -1)
        EVUTIL_CLOSESOCKET (c->mSocket);
    c->mSocket = -1;

    if (c->mEvent != NULL)
        bufferevent_free (c->mEvent);
    c->mEvent = NULL;
}